

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

char * Get_First_Whitespace_Character(char *buf,int blen)

{
  char *pcVar1;
  long lVar2;
  char *p;
  
  if ((buf != (char *)0x0) && (-1 < blen)) {
    for (lVar2 = 0; (pcVar1 = buf + lVar2, pcVar1 < buf + blen && (*pcVar1 != ' '));
        lVar2 = lVar2 + 1) {
    }
    if (blen == lVar2) {
      pcVar1 = buf;
    }
    return pcVar1;
  }
  __assert_fail("buf && blen>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0x10f,"char *Get_First_Whitespace_Character(char *, int)");
}

Assistant:

INLINE static char *Get_First_Whitespace_Character(char * buf, int blen)
{
  char *p   = buf;
  char *end = &p[blen];
  
  assert(buf && blen>=0);
  while( (p < end) && !is_blank(*p)) 
    p++;
  return( (p==end) ? buf : p );
}